

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  IRIns *pIVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  TValue *pTVar11;
  uint uVar12;
  ulong uVar13;
  SnapEntry SVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  SnapShot *pSVar18;
  
  uVar1 = (J->cur).nsnap;
  uVar13 = (ulong)uVar1;
  uVar17 = (J->cur).nsnapmap;
  uVar8 = (uint)uVar1;
  if (((uVar1 != 0) && ((J->cur).nins == (uint)(J->cur).snap[uVar13 - 1].ref)) ||
     ((J->mergesnap != '\0' && (-1 < (char)(J->guardemit).irt)))) {
    if (uVar8 != 1) {
      uVar13 = (ulong)(uVar8 - 1);
      uVar17 = (J->cur).snap[uVar13].mapofs;
      goto LAB_001527e4;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap <= uVar8) {
    lj_snap_grow_buf_(J,uVar1 + 1);
  }
  (J->cur).nsnap = (uint16_t)(uVar1 + 1);
LAB_001527e4:
  uVar8 = 0;
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  pSVar18 = (J->cur).snap + uVar13;
  uVar16 = J->maxslot + J->baseslot;
  uVar9 = J->framedepth + uVar17 + uVar16 + 1;
  if (J->sizesnapmap < uVar9) {
    lj_snap_grow_map_(J,uVar9);
  }
  pSVar4 = (J->cur).snapmap;
  if (uVar16 != 0) {
    uVar1 = J->chain[0xb];
    iVar10 = 0;
    uVar13 = 0;
    uVar8 = 0;
    do {
      uVar9 = J->slot[uVar13];
      uVar15 = (ulong)(uVar9 & 0xffff);
      if (uVar15 != 0) {
        SVar14 = iVar10 + (uVar9 & 0x3ffff);
        if (((((uVar9 & 0x30000) == 0) &&
             (pIVar5 = (J->cur).ir, *(char *)((long)pIVar5 + uVar15 * 8 + 5) == 'F')) &&
            (uVar13 == pIVar5[uVar15].field_0.op1)) && ((uint)uVar1 < (uVar9 & 0xffff))) {
          uVar2 = *(ushort *)((long)pIVar5 + uVar15 * 8 + 2);
          if ((uVar2 & 0x20) == 0) goto LAB_001528bc;
          if ((uVar2 & 0x11) != 1) {
            SVar14 = iVar10 + 0x40000 + (uVar9 & 0x3ffff);
          }
        }
        uVar15 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        pSVar4[uVar17 + uVar15] = SVar14;
      }
LAB_001528bc:
      uVar13 = uVar13 + 1;
      iVar10 = iVar10 + 0x1000000;
    } while (uVar16 != uVar13);
  }
  pSVar18->nent = (uint8_t)uVar8;
  pSVar4 = pSVar4 + (ulong)uVar17 + (ulong)uVar8;
  pTVar6 = J->L->base;
  pTVar11 = pTVar6 + -1;
  uVar9 = J->baseslot;
  if (*(char *)((ulong)pTVar6[-1].u32.lo + 6) == '\0') {
    pTVar7 = pTVar11 + *(byte *)((ulong)*(uint *)((ulong)pTVar6[-1].u32.lo + 0x10) - 0x39);
  }
  else {
    pTVar7 = J->L->top;
  }
  pTVar6 = pTVar6 + -(ulong)uVar9;
  *pSVar4 = *(SnapEntry *)&J->pc;
  uVar12 = 1;
  if (1 < uVar9) {
    uVar9 = 1;
    do {
      while( true ) {
        uVar3 = (pTVar11->field_2).it;
        if ((uVar3 & 3) != 0) break;
        pSVar4[uVar9] = uVar3;
        pTVar11 = pTVar11 + (-1 - (ulong)*(byte *)((ulong)(pTVar11->field_2).it - 3));
        uVar9 = uVar9 + 1;
LAB_00152993:
        if (pTVar7 < pTVar11 + *(byte *)((ulong)*(uint *)((ulong)(pTVar11->u32).lo + 0x10) - 0x39))
        {
          pTVar7 = pTVar11 + *(byte *)((ulong)*(uint *)((ulong)(pTVar11->u32).lo + 0x10) - 0x39);
        }
        uVar12 = uVar9;
        if (pTVar11 <= pTVar6) goto LAB_001529b8;
      }
      uVar12 = uVar9 + 1;
      pSVar4[uVar9] = uVar3;
      if ((uVar3 & 7) == 2) {
        pSVar4[uVar12] = *(SnapEntry *)((long)pTVar11 - 4);
        pTVar11 = (TValue *)
                  ((long)pTVar11 - ((long)(int)(pTVar11->field_2).it & 0xfffffffffffffff8U));
        uVar9 = uVar9 + 2;
        goto LAB_00152993;
      }
      pTVar11 = (TValue *)((long)pTVar11 - ((long)(int)(pTVar11->field_2).it & 0xfffffffffffffff8U))
      ;
      uVar9 = uVar12;
    } while (pTVar6 < pTVar11);
  }
LAB_001529b8:
  pSVar18->topslot = (uint8_t)((uint)((int)pTVar7 - (int)pTVar6) >> 3);
  pSVar18->mapofs = uVar17;
  pSVar18->ref = (IRRef1)(J->cur).nins;
  pSVar18->mcofs = 0;
  pSVar18->nslots = (uint8_t)uVar16;
  pSVar18->count = '\0';
  (J->cur).nsnapmap = uVar8 + uVar17 + uVar12;
  return;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}